

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

void packint(luaL_Buffer *b,lua_Unsigned n,int islittle,uint size,int neg)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  pcVar8 = luaL_prepbuffsize(b,(ulong)size);
  uVar11 = 0;
  if (islittle == 0) {
    uVar11 = (ulong)(size - 1);
  }
  pcVar8[uVar11] = (char)n;
  if (1 < size) {
    uVar9 = size - 2;
    uVar10 = 1;
    do {
      uVar12 = uVar10;
      if (islittle == 0) {
        uVar12 = uVar9;
      }
      pcVar8[uVar12] = (char)(n >> 8);
      uVar10 = uVar10 + 1;
      bVar13 = uVar9 != 0;
      uVar9 = uVar9 - 1;
      n = n >> 8;
    } while (bVar13);
    if (8 < size && neg != 0) {
      uVar9 = size - 9;
      uVar12 = size - 0x18;
      uVar10 = 0x17;
      uVar14 = uVar9 ^ 0x80000000;
      uVar15 = uVar9 ^ 0x80000000;
      uVar16 = uVar9 ^ 0x80000000;
      uVar9 = uVar9 ^ 0x80000000;
      do {
        uVar1 = uVar10 - 0x17;
        if ((bool)(~((int)uVar14 < (int)(uVar1 ^ 0x80000000)) & 1)) {
          uVar2 = uVar12 + 0xf;
          if (islittle != 0) {
            uVar2 = uVar10 - 0xf;
          }
          pcVar8[uVar2] = -1;
        }
        bVar13 = (int)uVar15 < (int)((uVar1 | 1) ^ 0x80000000);
        auVar7._4_4_ = -(uint)((int)uVar16 < (int)((uVar1 | 2) ^ 0x80000000));
        auVar7._0_4_ = -(uint)bVar13;
        auVar7._8_4_ = -(uint)((int)uVar9 < (int)((uVar1 | 3) ^ 0x80000000));
        auVar7._12_4_ = 0;
        auVar18._8_4_ = 0xffffffff;
        auVar18._0_8_ = 0xffffffffffffffff;
        auVar18._12_4_ = 0xffffffff;
        if (!bVar13) {
          uVar2 = uVar12 + 0xe;
          if (islittle != 0) {
            uVar2 = uVar10 - 0xe;
          }
          pcVar8[uVar2] = -1;
        }
        auVar18 = (auVar7 << 0x20 ^ auVar18) >> 0x30;
        auVar18 = packsswb(auVar18,auVar18);
        if ((auVar18._0_4_ >> 0x18 & 1) != 0) {
          uVar2 = uVar12 + 0xc;
          if (islittle != 0) {
            uVar2 = uVar10 - 0xc;
          }
          pcVar8[uVar2] = -1;
        }
        auVar19._0_4_ = -(uint)((int)uVar14 < (int)((uVar1 | 4) ^ 0x80000000));
        auVar19._4_4_ = -(uint)((int)uVar15 < (int)((uVar1 | 5) ^ 0x80000000));
        auVar19._8_4_ = -(uint)((int)uVar16 < (int)((uVar1 | 6) ^ 0x80000000));
        auVar19._12_4_ = -(uint)((int)uVar9 < (int)((uVar1 | 7) ^ 0x80000000));
        if ((((ushort)auVar19._0_4_ ^ 0xffff) & 1) != 0) {
          uVar2 = uVar12 + 0xb;
          if (islittle != 0) {
            uVar2 = uVar10 - 0xb;
          }
          pcVar8[uVar2] = -1;
        }
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar19 = auVar19 ^ auVar4;
        auVar22._0_8_ = auVar19._0_8_ << 0x30;
        auVar22._8_8_ = auVar19._8_8_ << 0x30 | auVar19._0_8_ >> 0x10;
        auVar18 = packsswb(auVar22,auVar22);
        if ((auVar18._4_2_ >> 8 & 1) != 0) {
          uVar2 = uVar12 + 10;
          if (islittle != 0) {
            uVar2 = uVar10 - 10;
          }
          pcVar8[uVar2] = -1;
        }
        if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          uVar2 = uVar12 + 9;
          if (islittle != 0) {
            uVar2 = uVar10 - 9;
          }
          pcVar8[uVar2] = -1;
        }
        if ((auVar19._11_2_ >> 8 & 1) != 0) {
          uVar2 = uVar12 + 8;
          if (islittle != 0) {
            uVar2 = uVar10 - 8;
          }
          pcVar8[uVar2] = -1;
        }
        auVar20._0_4_ = -(uint)((int)uVar14 < (int)((uVar1 | 8) ^ 0x80000000));
        auVar20._4_4_ = -(uint)((int)uVar15 < (int)((uVar1 | 9) ^ 0x80000000));
        auVar20._8_4_ = -(uint)((int)uVar16 < (int)((uVar1 | 10) ^ 0x80000000));
        auVar20._12_4_ = -(uint)((int)uVar9 < (int)((uVar1 | 0xb) ^ 0x80000000));
        if ((((ushort)auVar20._0_4_ ^ 0xffff) & 1) != 0) {
          uVar2 = uVar12 + 7;
          if (islittle != 0) {
            uVar2 = uVar10 - 7;
          }
          pcVar8[uVar2] = -1;
        }
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        if ((SUB162(auVar20 ^ auVar5,3) >> 8 & 1) != 0) {
          uVar2 = uVar12 + 6;
          if (islittle != 0) {
            uVar2 = uVar10 - 6;
          }
          pcVar8[uVar2] = -1;
        }
        auVar18 = pshufhw(auVar20,auVar20,0);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        if (((auVar18 ^ auVar6) & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          uVar2 = uVar12 + 5;
          if (islittle != 0) {
            uVar2 = uVar10 - 5;
          }
          pcVar8[uVar2] = -1;
        }
        auVar18 = packsswb(auVar18 ^ auVar6,(auVar20 ^ auVar5) >> 0x30);
        if ((auVar18._10_2_ >> 8 & 1) != 0) {
          uVar2 = uVar12 + 4;
          if (islittle != 0) {
            uVar2 = uVar10 - 4;
          }
          pcVar8[uVar2] = -1;
        }
        auVar17._0_4_ = -(uint)((int)uVar14 < (int)((uVar1 | 0xc) ^ 0x80000000));
        auVar17._4_4_ = -(uint)((int)uVar15 < (int)((uVar1 | 0xd) ^ 0x80000000));
        auVar17._8_4_ = -(uint)((int)uVar16 < (int)((uVar1 | 0xe) ^ 0x80000000));
        auVar17._12_4_ = -(uint)((int)uVar9 < (int)((uVar1 | 0xf) ^ 0x80000000));
        if ((((ushort)auVar17._0_4_ ^ 0xffff) & 1) != 0) {
          uVar1 = uVar12 + 3;
          if (islittle != 0) {
            uVar1 = uVar10 - 3;
          }
          pcVar8[uVar1] = -1;
        }
        auVar21._8_4_ = 0xffffffff;
        auVar21._0_8_ = 0xffffffffffffffff;
        auVar21._12_4_ = 0xffffffff;
        auVar21 = auVar17 ^ auVar21;
        auVar23._0_8_ = auVar21._0_8_ << 0x30;
        auVar23._8_8_ = auVar21._8_8_ << 0x30 | auVar21._0_8_ >> 0x10;
        auVar18 = packsswb(auVar23,auVar23);
        if ((auVar18._12_2_ >> 8 & 1) != 0) {
          uVar1 = uVar12 + 2;
          if (islittle != 0) {
            uVar1 = uVar10 - 2;
          }
          pcVar8[uVar1] = -1;
        }
        auVar18 = pshufhw(auVar17,auVar17,0);
        if (((auVar18._14_2_ ^ 0xffff) & 1) != 0) {
          uVar1 = uVar12 + 1;
          if (islittle != 0) {
            uVar1 = uVar10 - 1;
          }
          pcVar8[uVar1] = -1;
        }
        if ((auVar21._14_2_ >> 8 & 1) != 0) {
          uVar1 = uVar10;
          if (islittle == 0) {
            uVar1 = uVar12;
          }
          pcVar8[uVar1] = -1;
        }
        uVar12 = uVar12 - 0x10;
        iVar3 = uVar10 - (size + 7 & 0xfffffff0);
        uVar10 = uVar10 + 0x10;
      } while (iVar3 != 7);
    }
  }
  b->n = b->n + (ulong)size;
  return;
}

Assistant:

static void packint (luaL_Buffer *b, lua_Unsigned n,
                     int islittle, unsigned size, int neg) {
  char *buff = luaL_prepbuffsize(b, size);
  unsigned i;
  buff[islittle ? 0 : size - 1] = (char)(n & MC);  /* first byte */
  for (i = 1; i < size; i++) {
    n >>= NB;
    buff[islittle ? i : size - 1 - i] = (char)(n & MC);
  }
  if (neg && size > SZINT) {  /* negative number need sign extension? */
    for (i = SZINT; i < size; i++)  /* correct extra bytes */
      buff[islittle ? i : size - 1 - i] = (char)MC;
  }
  luaL_addsize(b, size);  /* add result to buffer */
}